

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode setup_range(Curl_easy *data)

{
  undefined1 *puVar1;
  char *pcVar2;
  long lVar3;
  
  lVar3 = (data->set).set_resume_from;
  (data->state).resume_from = lVar3;
  if ((lVar3 == 0) && ((data->set).str[0x28] == (char *)0x0)) {
    puVar1 = &(data->state).field_0x7bf;
    *puVar1 = *puVar1 & 0xfb;
  }
  else {
    if (((data->state).field_0x7bf & 8) != 0) {
      (*Curl_cfree)((data->state).range);
      lVar3 = (data->state).resume_from;
    }
    if (lVar3 == 0) {
      pcVar2 = (*Curl_cstrdup)((data->set).str[0x28]);
    }
    else {
      pcVar2 = curl_maprintf("%ld-");
    }
    (data->state).range = pcVar2;
    if (pcVar2 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    puVar1 = &(data->state).field_0x7bf;
    *puVar1 = *puVar1 | 0xc;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode setup_range(struct Curl_easy *data)
{
  struct UrlState *s = &data->state;
  s->resume_from = data->set.set_resume_from;
  if(s->resume_from || data->set.str[STRING_SET_RANGE]) {
    if(s->rangestringalloc)
      free(s->range);

    if(s->resume_from)
      s->range = aprintf("%" FMT_OFF_T "-", s->resume_from);
    else
      s->range = strdup(data->set.str[STRING_SET_RANGE]);

    if(!s->range)
      return CURLE_OUT_OF_MEMORY;

    s->rangestringalloc = TRUE;

    /* tell ourselves to fetch this range */
    s->use_range = TRUE;        /* enable range download */
  }
  else
    s->use_range = FALSE; /* disable range download */

  return CURLE_OK;
}